

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockExpectedCall_callWithObjectParameter_Test::testBody
          (TEST_MockExpectedCall_callWithObjectParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  UtestShell *pUVar2;
  void *pvVar3;
  TestTerminator *pTVar4;
  char *pcVar5;
  SimpleString paramName;
  SimpleString local_78;
  MockNamedValue local_68;
  
  SimpleString::SimpleString(&local_78,"paramName");
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString((SimpleString *)&local_68,"ClassName");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])(pMVar1,&local_68,&local_78,0x123);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_68,pMVar1,&local_78);
  pvVar3 = MockNamedValue::getConstObjectPointer(&local_68);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0x13])
            (pUVar2,0x123,pvVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x153,pTVar4);
  MockNamedValue::~MockNamedValue(&local_68);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(&local_68,pMVar1,&local_78);
  pcVar5 = SimpleString::asCharString((SimpleString *)&local_68);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,"ClassName",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x154,pTVar4);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  pUVar2 = UtestShell::getCurrent();
  (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3c])(&local_68);
  pcVar5 = SimpleString::asCharString((SimpleString *)&local_68);
  (*pUVar2->_vptr_UtestShell[0xc])
            (pUVar2,"funcName -> ClassName paramName: <No comparator found for type: \"ClassName\">"
             ,pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x155);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  SimpleString::~SimpleString(&local_78);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameter)
{
    const SimpleString paramName = "paramName";
    void* value = (void*) 0x123;
    call->withParameterOfType("ClassName", paramName, value);
    POINTERS_EQUAL(value, call->getInputParameter(paramName).getConstObjectPointer());
    STRCMP_EQUAL("ClassName", call->getInputParameterType(paramName).asCharString());
    STRCMP_CONTAINS("funcName -> ClassName paramName: <No comparator found for type: \"ClassName\">", call->callToString().asCharString());
}